

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_aa93::OSTest_ConvertFileToMmapSize_Test::TestBody
          (OSTest_ConvertFileToMmapSize_Test *this)

{
  bool bVar1;
  unsigned_long_long *expected;
  char *message;
  AssertHelper *this_00;
  AssertionResult gtest_ar_4;
  Error *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_3;
  char *in_stack_00000160;
  PredicateFormatterFromMatcher<testing::Matcher<unsigned_long>_> *in_stack_00000168;
  AssertionResult gtest_ar_2;
  ULongLong max_long_long;
  ULongLong max_size;
  AssertionFailure *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Matcher<unsigned_long> *in_stack_fffffffffffffd78;
  AssertHelper *in_stack_fffffffffffffd80;
  unsigned_long_long *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  char *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  Type in_stack_fffffffffffffdac;
  CStringRef in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  Message *in_stack_fffffffffffffdf8;
  AssertHelper *in_stack_fffffffffffffe00;
  BasicCStringRef<char> local_1a8;
  size_t local_1a0;
  AssertionResult local_198 [3];
  BasicCStringRef<char> local_168;
  byte local_15a;
  allocator<char> local_159;
  string local_158 [32];
  AssertionResult local_138 [2];
  BasicCStringRef<char> local_118;
  size_t local_110;
  AssertionResult local_108;
  unsigned_long_long *local_f8;
  unsigned_long_long *local_f0;
  int local_c4;
  BasicCStringRef<char> local_c0;
  byte local_b2;
  allocator<char> local_b1;
  string local_b0 [32];
  AssertionResult local_90 [2];
  BasicCStringRef<char> local_70;
  size_t local_68;
  undefined4 local_4c;
  AssertionResult local_18;
  
  local_4c = 0x2a;
  testing::TypedEq<unsigned_long,unsigned_int>((uint *)in_stack_fffffffffffffd88);
  testing::internal::MakePredicateFormatterFromMatcher<testing::Matcher<unsigned_long>>
            (in_stack_fffffffffffffd78);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_70,"");
  local_68 = mp::internal::ConvertFileToMmapSize
                       (CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                        in_stack_fffffffffffffdb0);
  testing::internal::PredicateFormatterFromMatcher<testing::Matcher<unsigned_long>>::operator()
            (in_stack_00000168,in_stack_00000160,(unsigned_long *)gtest_ar_3.message_.ptr_);
  testing::internal::PredicateFormatterFromMatcher<testing::Matcher<unsigned_long>_>::
  ~PredicateFormatterFromMatcher
            ((PredicateFormatterFromMatcher<testing::Matcher<unsigned_long>_> *)0x114903);
  testing::Matcher<unsigned_long>::~Matcher((Matcher<unsigned_long> *)0x114910);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdb0.data_);
    testing::AssertionResult::failure_message((AssertionResult *)0x11498d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffdb0.data_,in_stack_fffffffffffffdac,
               in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd80);
    testing::Message::~Message((Message *)0x1149f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x114a61);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_90);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (allocator<char> *)in_stack_fffffffffffffdb0.data_);
    std::allocator<char>::~allocator(&local_b1);
    local_b2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_c0,"");
      mp::internal::ConvertFileToMmapSize
                (CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                 in_stack_fffffffffffffdb0);
    }
    if ((local_b2 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffdb0.data_,
                 (char (*) [129])CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      local_c4 = 2;
    }
    else {
      local_c4 = 0;
    }
    std::__cxx11::string::~string(local_b0);
    if (local_c4 != 0) goto LAB_00114dcc;
  }
  else {
LAB_00114dcc:
    testing::Message::Message((Message *)in_stack_fffffffffffffdb0.data_);
    testing::AssertionResult::failure_message((AssertionResult *)0x114de8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffdb0.data_,in_stack_fffffffffffffdac,
               in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd80);
    testing::Message::~Message((Message *)0x114e45);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x114eb6);
  local_f0 = (unsigned_long_long *)std::numeric_limits<unsigned_long>::max();
  expected = (unsigned_long_long *)std::numeric_limits<long_long>::max();
  local_f8 = expected;
  if (expected <= local_f0) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_1a8,"");
    local_1a0 = mp::internal::ConvertFileToMmapSize
                          (CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                           in_stack_fffffffffffffdb0);
    testing::internal::EqHelper<false>::Compare<unsigned_long_long,unsigned_long>
              ((char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               in_stack_fffffffffffffd90,expected,(unsigned_long *)in_stack_fffffffffffffd80);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_198);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdb0.data_);
      this_00 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0x11553e);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffdb0.data_,in_stack_fffffffffffffdac,
                 in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x11559b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x115606);
    return;
  }
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_118,"");
  local_110 = mp::internal::ConvertFileToMmapSize
                        (CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                         in_stack_fffffffffffffdb0);
  testing::internal::EqHelper<false>::Compare<unsigned_long_long,unsigned_long>
            ((char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (unsigned_long *)in_stack_fffffffffffffd80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdb0.data_);
    testing::AssertionResult::failure_message((AssertionResult *)0x114f92);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffdb0.data_,in_stack_fffffffffffffdac,
               in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd80);
    testing::Message::~Message((Message *)0x114fef);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x115060);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_138);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (allocator<char> *)in_stack_fffffffffffffdb0.data_);
    std::allocator<char>::~allocator(&local_159);
    local_15a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_168,"test");
      mp::internal::ConvertFileToMmapSize
                (CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                 in_stack_fffffffffffffdb0);
    }
    if ((local_15a & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffdb0.data_,
                 (char (*) [136])CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      local_c4 = 3;
    }
    else {
      local_c4 = 0;
    }
    std::__cxx11::string::~string(local_158);
    if (local_c4 == 0) goto LAB_00115480;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffdb0.data_);
  message = testing::AssertionResult::failure_message((AssertionResult *)0x1153c5);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffdb0.data_,in_stack_fffffffffffffdac,
             in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,message);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd80);
  testing::Message::~Message((Message *)0x115422);
LAB_00115480:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11548d);
  return;
}

Assistant:

TEST(OSTest, ConvertFileToMmapSize) {
  EXPECT_THAT(mp::internal::ConvertFileToMmapSize(42, ""),
              testing::TypedEq<std::size_t>(42u));
  EXPECT_ASSERT(mp::internal::ConvertFileToMmapSize(-1, ""),
                "negative file size");
  fmt::ULongLong max_size = std::numeric_limits<std::size_t>::max();
  fmt::ULongLong max_long_long = std::numeric_limits<fmt::LongLong>::max();
  if (max_size < max_long_long) {
    EXPECT_EQ(max_size, mp::internal::ConvertFileToMmapSize(max_size, ""));
    EXPECT_THROW_MSG(mp::internal::ConvertFileToMmapSize(max_size + 1, "test"),
                     mp::Error, "file test is too big");
  } else {
    EXPECT_EQ(max_long_long,
              mp::internal::ConvertFileToMmapSize(max_long_long, ""));
  }
}